

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QAbstractTextDocumentLayout::Selection>::
emplace<QAbstractTextDocumentLayout::Selection_const&>
          (QMovableArrayOps<QAbstractTextDocumentLayout::Selection> *this,qsizetype i,
          Selection *args)

{
  Selection **ppSVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  Selection *pSVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_70;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
           super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_004d71d0:
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor((QTextCursor *)&local_48,&args->cursor);
    QTextFormat::QTextFormat((QTextFormat *)&puStack_40,&(args->format).super_QTextFormat);
    bVar6 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
            super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size != 0;
    QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::detachAndGrow
              ((QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)this,
               (uint)(i == 0 && bVar6),1,(Selection **)0x0,
               (QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)0x0);
    if (i == 0 && bVar6) {
      pSVar5 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
               super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr;
      QTextCursor::QTextCursor(&pSVar5[-1].cursor,(QTextCursor *)&local_48);
      QTextFormat::QTextFormat(&pSVar5[-1].format.super_QTextFormat,(QTextFormat *)&puStack_40);
      ppSVar1 = &(this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                 super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr;
      *ppSVar1 = *ppSVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_70.displaceTo =
           (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
           super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr;
      local_70.displaceFrom = local_70.displaceTo + i;
      local_70.displaceTo = local_70.displaceTo + i + 1;
      local_70.nInserts = 1;
      local_70.bytes =
           ((this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
            super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size - i) * 0x18;
      local_70.data = (QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *)this;
      memmove(local_70.displaceTo,local_70.displaceFrom,local_70.bytes);
      pSVar5 = local_70.displaceFrom;
      QTextCursor::QTextCursor(&(local_70.displaceFrom)->cursor,(QTextCursor *)&local_48);
      QTextFormat::QTextFormat(&(pSVar5->format).super_QTextFormat,(QTextFormat *)&puStack_40);
      local_70.displaceFrom = local_70.displaceFrom + 1;
      Inserter::~Inserter(&local_70);
    }
    QTextFormat::~QTextFormat((QTextFormat *)&puStack_40);
    QTextCursor::~QTextCursor((QTextCursor *)&local_48);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
            super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                      super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      pSVar5 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
               super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr;
      QTextCursor::QTextCursor(&pSVar5[lVar4].cursor,&args->cursor);
      QTextFormat::QTextFormat
                (&pSVar5[lVar4].format.super_QTextFormat,&(args->format).super_QTextFormat);
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((Selection *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
             super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr))
      goto LAB_004d71d0;
      pSVar5 = (this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
               super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr;
      QTextCursor::QTextCursor(&pSVar5[-1].cursor,&args->cursor);
      QTextFormat::QTextFormat
                (&pSVar5[-1].format.super_QTextFormat,&(args->format).super_QTextFormat);
      ppSVar1 = &(this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
                 super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.ptr;
      *ppSVar1 = *ppSVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QAbstractTextDocumentLayout::Selection>).
              super_QArrayDataPointer<QAbstractTextDocumentLayout::Selection>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }